

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O1

void __thiscall
ot::commissioner::persistent_storage::Network::Network
          (Network *this,NetworkId *aId,DomainId *aDomainId,string *aName,uint64_t aXpan,
          uint aChannel,uint16_t aPan,string *aMlp,int aCcm)

{
  pointer pcVar1;
  
  (this->mId).mId = aId->mId;
  (this->mDomainId).mId = aDomainId->mId;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (aName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mName,pcVar1,pcVar1 + aName->_M_string_length);
  this->mXpan = aXpan;
  this->mChannel = aChannel;
  this->mPan = aPan;
  (this->mMlp)._M_dataplus._M_p = (pointer)&(this->mMlp).field_2;
  pcVar1 = (aMlp->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mMlp,pcVar1,pcVar1 + aMlp->_M_string_length);
  this->mCcm = aCcm;
  return;
}

Assistant:

Network::Network(const NetworkId   &aId,
                 const DomainId    &aDomainId,
                 const std::string &aName,
                 uint64_t           aXpan,
                 unsigned int       aChannel,
                 uint16_t           aPan,
                 const std::string &aMlp,
                 int                aCcm)
    : mId(aId)
    , mDomainId(aDomainId)
    , mName(aName)
    , mXpan(aXpan)
    , mChannel(aChannel)
    , mPan(aPan)
    , mMlp(aMlp)
    , mCcm(aCcm)
{
}